

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

void get_children(Parser *p,PNode *pn,VecPNode *ps,VecPNode *ps2,VecPNode *ph)

{
  PNode *pPVar1;
  PNode *pPVar2;
  int iVar3;
  uint32 uVar4;
  PNode *_t;
  PNode *c;
  uint i;
  VecPNode *ph_local;
  VecPNode *ps2_local;
  VecPNode *ps_local;
  PNode *pn_local;
  Parser *p_local;
  
  iVar3 = set_find(ps2,pn);
  if (iVar3 == 0) {
    for (c._4_4_ = 0; c._4_4_ < (pn->children).n; c._4_4_ = c._4_4_ + 1) {
      pPVar1 = (pn->children).v[c._4_4_];
      while (pPVar1->latest != pPVar1->latest->latest) {
        pPVar2 = pPVar1->latest->latest;
        pPVar2->refcount = pPVar2->refcount + 1;
        uVar4 = pPVar1->latest->refcount - 1;
        pPVar1->latest->refcount = uVar4;
        if (uVar4 == 0) {
          free_PNode(p,pPVar1->latest);
        }
        pPVar1->latest = pPVar2;
      }
      pPVar1 = pPVar1->latest;
      iVar3 = set_add(ps,pPVar1);
      if ((iVar3 != 0) && (iVar3 = set_find(ps2,pPVar1), iVar3 == 0)) {
        heap_insert(ph,pPVar1);
      }
    }
  }
  return;
}

Assistant:

static void get_children(Parser *p, PNode *pn, VecPNode *ps, VecPNode *ps2, VecPNode *ph) {
  uint i;
  if (!set_find(ps2, pn)) {
    for (i = 0; i < pn->children.n; i++) {
      PNode *c = pn->children.v[i];
      LATEST(p, c);
      if (set_add(ps, c)) {
        if (!set_find(ps2, c))
          heap_insert(ph, c);
      }
    }
  }
}